

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void sort_areas(void)

{
  AREA_DATA_conflict *pAVar1;
  AREA_DATA_conflict *pAVar2;
  AREA_DATA_conflict **ppAVar3;
  AREA_DATA_conflict *pAVar4;
  int iVar5;
  bool bVar6;
  
  if (area_first != (AREA_DATA_conflict *)0x0) {
    bVar6 = true;
    pAVar4 = area_first;
LAB_002827ce:
    do {
      pAVar1 = pAVar4->next;
      if (pAVar1 != (AREA_DATA_conflict *)0x0) {
        if (pAVar1->min_vnum < pAVar4->min_vnum) {
          pAVar2 = pAVar1->next;
          if (pAVar2 != (AREA_DATA_conflict *)0x0) {
            pAVar2->prev = pAVar4;
          }
          bVar6 = pAVar4 == area_first;
          pAVar1->prev = pAVar4->prev;
          if (bVar6) {
            pAVar4->prev = pAVar1;
            pAVar1->next = pAVar4;
            pAVar4->next = pAVar2;
            area_first = pAVar1;
          }
          else {
            pAVar4->prev->next = pAVar1;
            pAVar1 = pAVar4->next;
            pAVar4->prev = pAVar1;
            pAVar2 = pAVar1->next;
            pAVar1->next = pAVar4;
            pAVar4->next = pAVar2;
          }
          bVar6 = false;
        }
        ppAVar3 = &pAVar4->next;
        pAVar4 = *ppAVar3;
        if (*ppAVar3 != (AREA_DATA_conflict *)0x0) goto LAB_002827ce;
      }
      if (bVar6) break;
      bVar6 = true;
      pAVar4 = area_first;
    } while (area_first != (AREA_DATA_conflict *)0x0);
  }
  if (area_first != (AREA_DATA_conflict *)0x0) {
    iVar5 = 0;
    pAVar4 = area_first;
    do {
      pAVar4->vnum = iVar5;
      iVar5 = iVar5 + 1;
      pAVar4 = pAVar4->next;
    } while (pAVar4 != (AREA_DATA_conflict *)0x0);
  }
  return;
}

Assistant:

void sort_areas(void)
{
	AREA_DATA *placeholder;
	AREA_DATA *pArea;
	bool sorted= false;
	bool first= false;
	int vnum = 0;

	while (!sorted)
	{
		sorted = true;

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			first= false;

			if (!pArea->next)
				break;

			if (pArea == area_first)
				first = true;

			if (pArea->min_vnum > pArea->next->min_vnum)
			{
				sorted= false;

				if (pArea->next->next)
					pArea->next->next->prev = pArea;

				pArea->next->prev = pArea->prev;

				if (!first)
					pArea->prev->next = pArea->next;

				pArea->prev = pArea->next;
				placeholder = pArea->next->next;
				pArea->next->next = pArea;
				pArea->next = placeholder;

				if (first)
					area_first = pArea->prev;
			}
		}
	}

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		pArea->vnum = vnum;
		vnum++;
	}
}